

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool medit_size(CHAR_DATA *ch,char *argument)

{
  long lVar1;
  int iVar2;
  CHAR_DATA *in_RSI;
  char *in_RDI;
  int value;
  MOB_INDEX_DATA *pMob;
  char *in_stack_000011e0;
  flag_type *in_stack_000011e8;
  
  if (*(char *)&in_RSI->next != '\0') {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x80) + 0x6c60);
    iVar2 = flag_value(in_stack_000011e8,in_stack_000011e0);
    if (iVar2 != -99) {
      *(short *)(lVar1 + 0x148) = (short)iVar2;
      send_to_char(in_RDI,in_RSI);
      return true;
    }
  }
  send_to_char(in_RDI,in_RSI);
  return false;
}

Assistant:

bool medit_size(CHAR_DATA *ch, char *argument)
{
	MOB_INDEX_DATA *pMob;
	int value;

	if (argument[0] != '\0')
	{
		EDIT_MOB(ch, pMob);

		value = flag_value(size_flags, argument);

		if (value != NO_FLAG)
		{
			pMob->size = value;
			send_to_char("Size set.\n\r", ch);
			return true;
		}
	}

	send_to_char("Syntax: size [size]\n\r"\
				 "Type '? size' for a list of sizes.\n\r",
				 ch);
	return false;
}